

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O2

void secp256k1_ecmult_strauss_wnaf
               (secp256k1_strauss_state *state,secp256k1_gej *r,size_t num,secp256k1_gej *a,
               secp256k1_scalar *na,secp256k1_scalar *ng)

{
  secp256k1_fe *psVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  secp256k1_strauss_point_state *psVar5;
  int w;
  uint uVar6;
  secp256k1_gej *r_00;
  undefined8 uVar7;
  secp256k1_scalar *a_00;
  secp256k1_scalar *a_01;
  secp256k1_scalar *a_02;
  secp256k1_scalar *a_03;
  long lVar8;
  long lVar9;
  secp256k1_gej *psVar10;
  uint64_t *puVar11;
  secp256k1_ge *psVar12;
  char *pcVar13;
  uint uVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  bool bVar19;
  byte bVar20;
  long local_508;
  uint local_500;
  uint local_4fc;
  secp256k1_scalar ng_128;
  secp256k1_scalar ng_1;
  secp256k1_fe Z;
  secp256k1_ge tmpa;
  int wnaf_ng_128 [129];
  int wnaf_ng_1 [129];
  
  bVar20 = 0;
  r_00 = a;
  psVar10 = (secp256k1_gej *)na;
  secp256k1_fe_set_int(&Z,1);
  uVar14 = 0;
  lVar17 = 0;
  do {
    bVar19 = num == 0;
    num = num - 1;
    if (bVar19) {
      if (lVar17 != 0) {
        secp256k1_ge_table_set_globalz(lVar17 * 4,state->pre_a,state->aux);
      }
      lVar8 = 0;
      lVar18 = 0;
      for (lVar15 = 0; lVar15 != lVar17; lVar15 = lVar15 + 1) {
        lVar16 = lVar8;
        for (lVar9 = 0; lVar9 != 0xc0; lVar9 = lVar9 + 0x30) {
          secp256k1_fe_mul((secp256k1_fe *)((long)state->aux->n + lVar9 + lVar18),
                           (secp256k1_fe *)((long)(state->pre_a->x).n + lVar16),
                           &secp256k1_const_beta);
          lVar16 = lVar16 + 0x68;
        }
        lVar18 = lVar18 + 0xc0;
        lVar8 = lVar8 + 0x1a0;
      }
      if (ng == (secp256k1_scalar *)0x0) {
        local_4fc = 0;
        local_500 = 0;
      }
      else {
        secp256k1_scalar_verify(ng);
        ng_1 = *ng;
        ng_128 = 0;
        secp256k1_scalar_verify(&ng_1);
        secp256k1_scalar_verify(&ng_128);
        local_4fc = secp256k1_ecmult_wnaf(wnaf_ng_1,(int)&ng_1,a_02,(int)r_00);
        local_500 = secp256k1_ecmult_wnaf(wnaf_ng_128,(int)&ng_128,a_03,(int)r_00);
        if ((int)uVar14 < (int)local_4fc) {
          uVar14 = local_4fc;
        }
        if ((int)uVar14 < (int)local_500) {
          uVar14 = local_500;
        }
      }
      secp256k1_gej_set_infinity(r);
      uVar4 = (ulong)uVar14;
      local_508 = uVar4 * 4;
      while (iVar2 = (int)uVar4, 0 < iVar2) {
        uVar4 = uVar4 - 1;
        psVar10 = r;
        secp256k1_gej_double_var(r,r,(secp256k1_fe *)0x0);
        lVar18 = 0x40c;
        lVar16 = 0;
        lVar8 = 0x30;
        lVar15 = lVar17;
        while (bVar19 = lVar15 != 0, lVar15 = lVar15 + -1, bVar19) {
          psVar5 = state->ps;
          if (iVar2 <= *(int *)((long)psVar5->wnaf_na_1 + lVar18 + -4)) {
            r_00 = (secp256k1_gej *)((long)psVar5->wnaf_na_1 + local_508);
            uVar14 = *(uint *)(lVar18 + -0x410 + (long)r_00);
            if (uVar14 != 0) {
              psVar12 = state->pre_a;
              secp256k1_ecmult_table_verify(uVar14,(int)psVar10);
              if ((int)uVar14 < 1) {
                puVar11 = (uint64_t *)((long)(&psVar12[~uVar14 >> 1].x + -1) + lVar8);
                psVar12 = &tmpa;
                for (lVar9 = 0xd; lVar9 != 0; lVar9 = lVar9 + -1) {
                  (psVar12->x).n[0] = *puVar11;
                  puVar11 = puVar11 + (ulong)bVar20 * -2 + 1;
                  psVar12 = (secp256k1_ge *)((long)psVar12 + (ulong)bVar20 * -0x10 + 8);
                }
                secp256k1_fe_negate_unchecked(&tmpa.y,&tmpa.y,1);
              }
              else {
                puVar11 = (uint64_t *)((long)(&psVar12[uVar14 - 1 >> 1].x + -1) + lVar8);
                psVar12 = &tmpa;
                for (lVar9 = 0xd; lVar9 != 0; lVar9 = lVar9 + -1) {
                  (psVar12->x).n[0] = *puVar11;
                  puVar11 = puVar11 + (ulong)bVar20 * -2 + 1;
                  psVar12 = (secp256k1_ge *)((long)psVar12 + (ulong)bVar20 * -0x10 + 8);
                }
              }
              r_00 = (secp256k1_gej *)0x0;
              psVar10 = r;
              secp256k1_gej_add_ge_var(r,r,&tmpa,(secp256k1_fe *)0x0);
              psVar5 = state->ps;
            }
          }
          if ((iVar2 <= *(int *)((long)psVar5->wnaf_na_1 + lVar18)) &&
             (uVar14 = *(uint *)((long)psVar5 + lVar18 + -0x20c + local_508), uVar14 != 0)) {
            psVar1 = state->aux;
            psVar12 = state->pre_a;
            secp256k1_ecmult_table_verify(uVar14,(int)psVar10);
            if ((int)uVar14 < 1) {
              secp256k1_ge_set_xy(&tmpa,(secp256k1_fe *)((long)psVar1[~uVar14 >> 1].n + lVar16),
                                  (secp256k1_fe *)((long)psVar12[~uVar14 >> 1].x.n + lVar8));
              secp256k1_fe_negate_unchecked(&tmpa.y,&tmpa.y,1);
            }
            else {
              uVar14 = uVar14 - 1 >> 1;
              secp256k1_ge_set_xy(&tmpa,(secp256k1_fe *)((long)psVar1[uVar14].n + lVar16),
                                  (secp256k1_fe *)((long)psVar12[uVar14].x.n + lVar8));
            }
            r_00 = (secp256k1_gej *)0x0;
            psVar10 = r;
            secp256k1_gej_add_ge_var(r,r,&tmpa,(secp256k1_fe *)0x0);
          }
          lVar8 = lVar8 + 0x1a0;
          lVar16 = lVar16 + 0xc0;
          lVar18 = lVar18 + 0x410;
        }
        if ((iVar2 <= (int)local_4fc) && (wnaf_ng_1[uVar4] != 0)) {
          secp256k1_ecmult_table_get_ge_storage(&tmpa,secp256k1_pre_g,wnaf_ng_1[uVar4],(int)r_00);
          r_00 = (secp256k1_gej *)&Z;
          secp256k1_gej_add_zinv_var(r,r,&tmpa,(secp256k1_fe *)r_00);
        }
        if ((iVar2 <= (int)local_500) && (wnaf_ng_128[uVar4] != 0)) {
          secp256k1_ecmult_table_get_ge_storage
                    (&tmpa,secp256k1_pre_g_128,wnaf_ng_128[uVar4],(int)r_00);
          r_00 = (secp256k1_gej *)&Z;
          secp256k1_gej_add_zinv_var(r,r,&tmpa,(secp256k1_fe *)r_00);
        }
        local_508 = local_508 + -4;
      }
      if (r->infinity == 0) {
        secp256k1_fe_mul(&r->z,&r->z,&Z);
      }
      return;
    }
    iVar2 = secp256k1_scalar_is_zero(na);
    if (iVar2 == 0) {
      iVar2 = secp256k1_gej_is_infinity(a);
      w = (int)r_00;
      if (iVar2 == 0) {
        secp256k1_scalar_split_lambda((secp256k1_scalar *)wnaf_ng_128,(secp256k1_scalar *)&tmpa,na);
        iVar2 = secp256k1_ecmult_wnaf(state->ps[lVar17].wnaf_na_1,(int)wnaf_ng_128,a_00,w);
        psVar5 = state->ps;
        psVar5[lVar17].bits_na_1 = iVar2;
        uVar3 = secp256k1_ecmult_wnaf(psVar5[lVar17].wnaf_na_lam,(int)&tmpa,a_01,(int)psVar5);
        psVar5 = state->ps;
        psVar5[lVar17].bits_na_lam = uVar3;
        uVar6 = psVar5[lVar17].bits_na_1;
        if (0x81 < (int)uVar6) {
          pcVar13 = "test condition failed: state->ps[no].bits_na_1 <= 129";
          uVar7 = 0x108;
LAB_00111f8b:
          fprintf(_stderr,"%s:%d: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/ecmult_impl.h"
                  ,uVar7,pcVar13);
          abort();
        }
        if (0x81 < (int)uVar3) {
          pcVar13 = "test condition failed: state->ps[no].bits_na_lam <= 129";
          uVar7 = 0x109;
          goto LAB_00111f8b;
        }
        if ((int)uVar6 <= (int)uVar14) {
          uVar6 = uVar14;
        }
        uVar14 = uVar6;
        if ((int)uVar6 < (int)uVar3) {
          uVar14 = uVar3;
        }
        r_00 = (secp256k1_gej *)wnaf_ng_1;
        memcpy(r_00,a,0x98);
        if (lVar17 != 0) {
          secp256k1_gej_rescale(r_00,&Z);
        }
        secp256k1_ecmult_odd_multiples_table
                  ((int)lVar17 * 0x1a0 + (int)state->pre_a,(secp256k1_ge *)(state->aux + lVar17 * 4)
                   ,&Z,(secp256k1_fe *)r_00,psVar10);
        if (lVar17 != 0) {
          secp256k1_fe_mul(state->aux + lVar17 * 4,state->aux + lVar17 * 4,&a->z);
        }
        lVar17 = lVar17 + 1;
      }
    }
    na = na + 1;
    a = a + 1;
  } while( true );
}

Assistant:

static void secp256k1_ecmult_strauss_wnaf(const struct secp256k1_strauss_state *state, secp256k1_gej *r, size_t num, const secp256k1_gej *a, const secp256k1_scalar *na, const secp256k1_scalar *ng) {
    secp256k1_ge tmpa;
    secp256k1_fe Z;
    /* Split G factors. */
    secp256k1_scalar ng_1, ng_128;
    int wnaf_ng_1[129];
    int bits_ng_1 = 0;
    int wnaf_ng_128[129];
    int bits_ng_128 = 0;
    int i;
    int bits = 0;
    size_t np;
    size_t no = 0;

    secp256k1_fe_set_int(&Z, 1);
    for (np = 0; np < num; ++np) {
        secp256k1_gej tmp;
        secp256k1_scalar na_1, na_lam;
        if (secp256k1_scalar_is_zero(&na[np]) || secp256k1_gej_is_infinity(&a[np])) {
            continue;
        }
        /* split na into na_1 and na_lam (where na = na_1 + na_lam*lambda, and na_1 and na_lam are ~128 bit) */
        secp256k1_scalar_split_lambda(&na_1, &na_lam, &na[np]);

        /* build wnaf representation for na_1 and na_lam. */
        state->ps[no].bits_na_1   = secp256k1_ecmult_wnaf(state->ps[no].wnaf_na_1,   129, &na_1,   WINDOW_A);
        state->ps[no].bits_na_lam = secp256k1_ecmult_wnaf(state->ps[no].wnaf_na_lam, 129, &na_lam, WINDOW_A);
        VERIFY_CHECK(state->ps[no].bits_na_1 <= 129);
        VERIFY_CHECK(state->ps[no].bits_na_lam <= 129);
        if (state->ps[no].bits_na_1 > bits) {
            bits = state->ps[no].bits_na_1;
        }
        if (state->ps[no].bits_na_lam > bits) {
            bits = state->ps[no].bits_na_lam;
        }

        /* Calculate odd multiples of a.
         * All multiples are brought to the same Z 'denominator', which is stored
         * in Z. Due to secp256k1' isomorphism we can do all operations pretending
         * that the Z coordinate was 1, use affine addition formulae, and correct
         * the Z coordinate of the result once at the end.
         * The exception is the precomputed G table points, which are actually
         * affine. Compared to the base used for other points, they have a Z ratio
         * of 1/Z, so we can use secp256k1_gej_add_zinv_var, which uses the same
         * isomorphism to efficiently add with a known Z inverse.
         */
        tmp = a[np];
        if (no) {
            secp256k1_gej_rescale(&tmp, &Z);
        }
        secp256k1_ecmult_odd_multiples_table(ECMULT_TABLE_SIZE(WINDOW_A), state->pre_a + no * ECMULT_TABLE_SIZE(WINDOW_A), state->aux + no * ECMULT_TABLE_SIZE(WINDOW_A), &Z, &tmp);
        if (no) secp256k1_fe_mul(state->aux + no * ECMULT_TABLE_SIZE(WINDOW_A), state->aux + no * ECMULT_TABLE_SIZE(WINDOW_A), &(a[np].z));

        ++no;
    }

    /* Bring them to the same Z denominator. */
    if (no) {
        secp256k1_ge_table_set_globalz(ECMULT_TABLE_SIZE(WINDOW_A) * no, state->pre_a, state->aux);
    }

    for (np = 0; np < no; ++np) {
        for (i = 0; i < ECMULT_TABLE_SIZE(WINDOW_A); i++) {
            secp256k1_fe_mul(&state->aux[np * ECMULT_TABLE_SIZE(WINDOW_A) + i], &state->pre_a[np * ECMULT_TABLE_SIZE(WINDOW_A) + i].x, &secp256k1_const_beta);
        }
    }

    if (ng) {
        /* split ng into ng_1 and ng_128 (where gn = gn_1 + gn_128*2^128, and gn_1 and gn_128 are ~128 bit) */
        secp256k1_scalar_split_128(&ng_1, &ng_128, ng);

        /* Build wnaf representation for ng_1 and ng_128 */
        bits_ng_1   = secp256k1_ecmult_wnaf(wnaf_ng_1,   129, &ng_1,   WINDOW_G);
        bits_ng_128 = secp256k1_ecmult_wnaf(wnaf_ng_128, 129, &ng_128, WINDOW_G);
        if (bits_ng_1 > bits) {
            bits = bits_ng_1;
        }
        if (bits_ng_128 > bits) {
            bits = bits_ng_128;
        }
    }

    secp256k1_gej_set_infinity(r);

    for (i = bits - 1; i >= 0; i--) {
        int n;
        secp256k1_gej_double_var(r, r, NULL);
        for (np = 0; np < no; ++np) {
            if (i < state->ps[np].bits_na_1 && (n = state->ps[np].wnaf_na_1[i])) {
                secp256k1_ecmult_table_get_ge(&tmpa, state->pre_a + np * ECMULT_TABLE_SIZE(WINDOW_A), n, WINDOW_A);
                secp256k1_gej_add_ge_var(r, r, &tmpa, NULL);
            }
            if (i < state->ps[np].bits_na_lam && (n = state->ps[np].wnaf_na_lam[i])) {
                secp256k1_ecmult_table_get_ge_lambda(&tmpa, state->pre_a + np * ECMULT_TABLE_SIZE(WINDOW_A), state->aux + np * ECMULT_TABLE_SIZE(WINDOW_A), n, WINDOW_A);
                secp256k1_gej_add_ge_var(r, r, &tmpa, NULL);
            }
        }
        if (i < bits_ng_1 && (n = wnaf_ng_1[i])) {
            secp256k1_ecmult_table_get_ge_storage(&tmpa, secp256k1_pre_g, n, WINDOW_G);
            secp256k1_gej_add_zinv_var(r, r, &tmpa, &Z);
        }
        if (i < bits_ng_128 && (n = wnaf_ng_128[i])) {
            secp256k1_ecmult_table_get_ge_storage(&tmpa, secp256k1_pre_g_128, n, WINDOW_G);
            secp256k1_gej_add_zinv_var(r, r, &tmpa, &Z);
        }
    }

    if (!r->infinity) {
        secp256k1_fe_mul(&r->z, &r->z, &Z);
    }
}